

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void getCompatibleInterfaceProperties
               (cmGeneratorTarget *target,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *ifaceProperties,string *config)

{
  cmGeneratorTarget *pcVar1;
  TargetType TVar2;
  cmComputeLinkInformation *this;
  ItemVector *pIVar3;
  cmLocalGenerator *this_00;
  ostream *poVar4;
  string *psVar5;
  pointer pIVar6;
  string sStack_1c8;
  ostringstream e;
  
  TVar2 = cmGeneratorTarget::GetType(target);
  if (TVar2 != OBJECT_LIBRARY) {
    this = cmGeneratorTarget::GetLinkInformation(target,config);
    if (this == (cmComputeLinkInformation *)0x0) {
      this_00 = cmGeneratorTarget::GetLocalGenerator(target);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar4 = std::operator<<((ostream *)&e,"Exporting the target \"");
      psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(target);
      poVar4 = std::operator<<(poVar4,(string *)psVar5);
      std::operator<<(poVar4,"\" is not allowed since its linker language cannot be determined");
      std::__cxx11::stringbuf::str();
      cmLocalGenerator::IssueMessage(this_00,FATAL_ERROR,&sStack_1c8);
      std::__cxx11::string::~string((string *)&sStack_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    }
    else {
      pIVar3 = cmComputeLinkInformation::GetItems(this);
      for (pIVar6 = (pIVar3->
                    super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pIVar6 != (pIVar3->
                    super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                    )._M_impl.super__Vector_impl_data._M_finish; pIVar6 = pIVar6 + 1) {
        pcVar1 = pIVar6->Target;
        if (pcVar1 != (cmGeneratorTarget *)0x0) {
          std::__cxx11::string::string
                    ((string *)&e,"COMPATIBLE_INTERFACE_BOOL",(allocator *)&sStack_1c8);
          getPropertyContents(pcVar1,(string *)&e,ifaceProperties);
          std::__cxx11::string::~string((string *)&e);
          pcVar1 = pIVar6->Target;
          std::__cxx11::string::string
                    ((string *)&e,"COMPATIBLE_INTERFACE_STRING",(allocator *)&sStack_1c8);
          getPropertyContents(pcVar1,(string *)&e,ifaceProperties);
          std::__cxx11::string::~string((string *)&e);
          pcVar1 = pIVar6->Target;
          std::__cxx11::string::string
                    ((string *)&e,"COMPATIBLE_INTERFACE_NUMBER_MIN",(allocator *)&sStack_1c8);
          getPropertyContents(pcVar1,(string *)&e,ifaceProperties);
          std::__cxx11::string::~string((string *)&e);
          pcVar1 = pIVar6->Target;
          std::__cxx11::string::string
                    ((string *)&e,"COMPATIBLE_INTERFACE_NUMBER_MAX",(allocator *)&sStack_1c8);
          getPropertyContents(pcVar1,(string *)&e,ifaceProperties);
          std::__cxx11::string::~string((string *)&e);
        }
      }
    }
  }
  return;
}

Assistant:

void getCompatibleInterfaceProperties(cmGeneratorTarget* target,
                                      std::set<std::string>& ifaceProperties,
                                      const std::string& config)
{
  if (target->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    // object libraries have no link information, so nothing to compute
    return;
  }

  cmComputeLinkInformation* info = target->GetLinkInformation(config);

  if (!info) {
    cmLocalGenerator* lg = target->GetLocalGenerator();
    std::ostringstream e;
    e << "Exporting the target \"" << target->GetName()
      << "\" is not "
         "allowed since its linker language cannot be determined";
    lg->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }

  const cmComputeLinkInformation::ItemVector& deps = info->GetItems();

  for (cmComputeLinkInformation::ItemVector::const_iterator li = deps.begin();
       li != deps.end(); ++li) {
    if (!li->Target) {
      continue;
    }
    getPropertyContents(li->Target, "COMPATIBLE_INTERFACE_BOOL",
                        ifaceProperties);
    getPropertyContents(li->Target, "COMPATIBLE_INTERFACE_STRING",
                        ifaceProperties);
    getPropertyContents(li->Target, "COMPATIBLE_INTERFACE_NUMBER_MIN",
                        ifaceProperties);
    getPropertyContents(li->Target, "COMPATIBLE_INTERFACE_NUMBER_MAX",
                        ifaceProperties);
  }
}